

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::minSelect(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int *nr,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *val,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *stab,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *bestDelta,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *max)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  int i;
  int i_00;
  double *pdVar2;
  DataKey DVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  ulong uVar7;
  byte bVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar8 = 0;
  pdVar2 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&best.m_backend,*pdVar2,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)bestDelta,0.0);
  this->iscoid = true;
  pnVar5 = max;
  pnVar6 = &local_b0;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar8 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  local_b0.m_backend.exp = (max->m_backend).exp;
  local_b0.m_backend.neg = (max->m_backend).neg;
  local_b0.m_backend.fpclass = (max->m_backend).fpclass;
  local_b0.m_backend.prec_elem = (max->m_backend).prec_elem;
  pSVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  i = minSelect(this,val,stab,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&best.m_backend,bestDelta,&local_b0,pSVar1->theCoPvec,pSVar1->theCoLbound,
                pSVar1->theCoUbound,0,1);
  this->iscoid = false;
  pnVar5 = max;
  pnVar6 = &local_130;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar8 * -2 + 1) * 4);
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar6 + ((ulong)bVar8 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = (max->m_backend).exp;
  local_130.m_backend.neg = (max->m_backend).neg;
  local_130.m_backend.fpclass = (max->m_backend).fpclass;
  local_130.m_backend.prec_elem = (max->m_backend).prec_elem;
  pSVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  i_00 = minSelect(this,val,stab,&best,bestDelta,&local_130,pSVar1->thePvec,pSVar1->theLbound,
                   pSVar1->theUbound,0,1);
  if (i_00 < 0) {
    uVar7 = 0xffffffff00000000;
    if (i < 0) {
      *nr = -1;
      DVar3.info = 0;
      DVar3.idx = 0;
      goto LAB_00454ce2;
    }
    *nr = i;
    DVar3 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::coId((this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,i);
  }
  else {
    *nr = i_00;
    DVar3 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,i_00);
  }
  uVar7 = (ulong)DVar3 & 0xffffffff00000000;
LAB_00454ce2:
  return (SPxId)((ulong)DVar3 & 0xffffffff | uVar7);
}

Assistant:

SPxId SPxFastRT<R>::minSelect(
   int& nr,
   R& val,
   R& stab,
   R& bestDelta,
   R max)
{
   R best = R(infinity);
   bestDelta = 0.0;
   iscoid = true;
   int indc = minSelect(val, stab, best, bestDelta, max,
                        this->thesolver->coPvec(), this->thesolver->lcBound(), this->thesolver->ucBound(), 0, 1);
   iscoid = false;
   int indp = minSelect(val, stab, best, bestDelta, max,
                        this->thesolver->pVec(), this->thesolver->lpBound(), this->thesolver->upBound(), 0, 1);

   if(indp >= 0)
   {
      nr = indp;
      return this->thesolver->id(indp);
   }

   if(indc >= 0)
   {
      nr = indc;
      return this->thesolver->coId(indc);
   }

   nr = -1;
   return SPxId();
}